

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionElimination.cc
# Opt level: O1

bool flow::transform::rewriteCondBrToSameBranches(IRHandler *handler)

{
  BasicBlock *this;
  BasicBlock *targetBlock;
  TerminateInstr *pTVar1;
  long lVar2;
  Instr *this_00;
  _List_node_base *p_Var3;
  byte unaff_R15B;
  _Head_base<0UL,_flow::Instr_*,_false> local_40;
  _func_int **local_38;
  
  p_Var3 = (_List_node_base *)&handler->blocks_;
  do {
    p_Var3 = (((_List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
                *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var3 == (_List_node_base *)&handler->blocks_) {
      unaff_R15B = 0;
      break;
    }
    this = (BasicBlock *)p_Var3[1]._M_next;
    pTVar1 = BasicBlock::getTerminator(this);
    if (pTVar1 == (TerminateInstr *)0x0) {
      lVar2 = 0;
    }
    else {
      lVar2 = __dynamic_cast(pTVar1,&TerminateInstr::typeinfo,&CondBrInstr::typeinfo,0);
    }
    if (lVar2 != 0) {
      targetBlock = *(BasicBlock **)(*(long *)(lVar2 + 0x50) + 8);
      if (targetBlock == *(BasicBlock **)(*(long *)(lVar2 + 0x50) + 0x10)) {
        BasicBlock::remove((BasicBlock *)&stack0xffffffffffffffc8,(char *)this);
        if (local_38 != (_func_int **)0x0) {
          (**(code **)(*local_38 + 8))();
        }
        local_38 = (_func_int **)0x0;
        this_00 = (Instr *)operator_new(0x68);
        BrInstr::BrInstr((BrInstr *)this_00,targetBlock);
        local_40._M_head_impl = this_00;
        BasicBlock::push_back
                  (this,(unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *)&local_40);
        if (local_40._M_head_impl != (Instr *)0x0) {
          (*(((TerminateInstr *)&(local_40._M_head_impl)->super_Value)->super_Instr).super_Value.
            _vptr_Value[1])();
        }
        local_40._M_head_impl = (Instr *)0x0;
        unaff_R15B = 1;
      }
      else {
        unaff_R15B = 0;
      }
    }
  } while (lVar2 == 0);
  return (bool)(unaff_R15B & 1);
}

Assistant:

bool rewriteCondBrToSameBranches(IRHandler* handler) {
  for (BasicBlock* bb : handler->basicBlocks()) {
    // attempt to eliminate useless condbr
    if (CondBrInstr* condbr = dynamic_cast<CondBrInstr*>(bb->getTerminator())) {
      if (condbr->trueBlock() != condbr->falseBlock())
        return false;

      BasicBlock* nextBB = condbr->trueBlock();

      // remove old terminator
      bb->remove(condbr);

      // create new terminator
      bb->push_back(std::make_unique<BrInstr>(nextBB));

      //FLOW_TRACE("flow: rewrote condbr with true-block == false-block");
      return true;
    }
  }

  return false;
}